

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommaInitializer.h
# Opt level: O0

CommaInitializer<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> * __thiscall
Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::operator_
          (CommaInitializer<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *this,
          Scalar *s)

{
  ScalarWithConstIfNotLvalue SVar1;
  long lVar2;
  Index IVar3;
  ScalarWithConstIfNotLvalue *pSVar4;
  Scalar *s_local;
  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *this_local;
  
  lVar2 = this->m_col;
  IVar3 = MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>::cols
                    ((MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0> *)
                     this->m_xpr);
  if (lVar2 == IVar3) {
    this->m_row = this->m_currentBlockRows + this->m_row;
    this->m_col = 0;
    this->m_currentBlockRows = 1;
    lVar2 = this->m_row;
    IVar3 = MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>::rows
                      ((MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>
                        *)this->m_xpr);
    if (IVar3 <= lVar2) {
      __assert_fail("m_row<m_xpr.rows() && \"Too many rows passed to comma initializer (operator<<)\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/CommaInitializer.h"
                    ,0x49,
                    "CommaInitializer<MatrixType> &Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double, 3, 3>, 1, 3>>::operator,(const Scalar &) [MatrixType = Eigen::Block<Eigen::Matrix<double, 3, 3>, 1, 3>]"
                   );
    }
  }
  lVar2 = this->m_col;
  IVar3 = MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>::cols
                    ((MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0> *)
                     this->m_xpr);
  if (lVar2 < IVar3) {
    if (this->m_currentBlockRows == 1) {
      SVar1 = *s;
      lVar2 = this->m_col;
      this->m_col = lVar2 + 1;
      pSVar4 = MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>::coeffRef
                         ((MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>
                           *)this->m_xpr,this->m_row,lVar2);
      *pSVar4 = SVar1;
      return this;
    }
    __assert_fail("m_currentBlockRows==1",
                  "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/CommaInitializer.h"
                  ,0x4d,
                  "CommaInitializer<MatrixType> &Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double, 3, 3>, 1, 3>>::operator,(const Scalar &) [MatrixType = Eigen::Block<Eigen::Matrix<double, 3, 3>, 1, 3>]"
                 );
  }
  __assert_fail("m_col<m_xpr.cols() && \"Too many coefficients passed to comma initializer (operator<<)\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/CommaInitializer.h"
                ,0x4c,
                "CommaInitializer<MatrixType> &Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double, 3, 3>, 1, 3>>::operator,(const Scalar &) [MatrixType = Eigen::Block<Eigen::Matrix<double, 3, 3>, 1, 3>]"
               );
}

Assistant:

EIGEN_DEVICE_FUNC
  CommaInitializer& operator,(const Scalar& s)
  {
    if (m_col==m_xpr.cols())
    {
      m_row+=m_currentBlockRows;
      m_col = 0;
      m_currentBlockRows = 1;
      eigen_assert(m_row<m_xpr.rows()
        && "Too many rows passed to comma initializer (operator<<)");
    }
    eigen_assert(m_col<m_xpr.cols()
      && "Too many coefficients passed to comma initializer (operator<<)");
    eigen_assert(m_currentBlockRows==1);
    m_xpr.coeffRef(m_row, m_col++) = s;
    return *this;
  }